

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

void Bbl_ManPrintStats(Bbl_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  iVar1 = p->pObjs->nSize;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < iVar1) {
    pcVar3 = p->pObjs->pArray;
    uVar6 = 0;
    uVar5 = 0;
    uVar8 = 0;
    do {
      if (pcVar3 == (char *)0x0) {
        uVar5 = 0;
        uVar6 = 0;
        break;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar2 = *(uint *)(pcVar3 + (ulong)uVar8 + 8);
      uVar9 = (uint)((uVar2 & 2) == 0);
      if ((uVar2 & 1) != 0) {
        uVar9 = 0;
      }
      uVar5 = (ulong)((int)uVar5 + uVar9);
      uVar8 = uVar8 + (uVar2 >> 4) * 4 + 0xc;
    } while ((int)uVar8 < iVar1);
  }
  iVar1 = p->pFncs->nSize;
  if (0 < iVar1) {
    pcVar3 = p->pFncs->pArray;
    uVar4 = 0;
    iVar7 = 0;
    do {
      if (pcVar3 == (char *)0x0) {
        uVar4 = 0;
        break;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      iVar7 = iVar7 + *(int *)(pcVar3 + iVar7) * 4 + 4;
    } while (iVar7 < iVar1);
  }
  printf("Total objects = %7d.  Total nodes = %7d. Unique functions = %7d.\n",uVar6,uVar5,uVar4);
  printf("Name manager = %5.2f MB\n",(double)p->pName->nSize * 9.5367431640625e-07);
  printf("Objs manager = %5.2f MB\n",(double)p->pObjs->nSize * 9.5367431640625e-07);
  printf("Fncs manager = %5.2f MB\n",(double)p->pFncs->nSize * 9.5367431640625e-07);
  return;
}

Assistant:

void Bbl_ManPrintStats( Bbl_Man_t * p )
{
    Bbl_Obj_t * pObj;
    Bbl_Fnc_t * pFnc;
    int h, nFuncs = 0, nNodes = 0, nObjs = 0;
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
        nObjs++, nNodes += Bbl_ObjIsNode(pObj);
    Bbl_ManForEachFnc_int( p->pFncs, pFnc, h )
        nFuncs++;
    printf( "Total objects = %7d.  Total nodes = %7d. Unique functions = %7d.\n", nObjs, nNodes, nFuncs );
    printf( "Name manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pName)/(1 << 20) );
    printf( "Objs manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pObjs)/(1 << 20) );
    printf( "Fncs manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pFncs)/(1 << 20) );
}